

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxsc.cpp
# Opt level: O1

void __thiscall ktxSupercompressor::usage(ktxSupercompressor *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(this->super_scApp).super_ktxApp.name._M_dataplus._M_p,
                      (this->super_scApp).super_ktxApp.name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             " [options] [<infile> ...]\n\n  infile       The ktx2 file(s) to supercompress. The output is written to a\n               file of the same name. If infile not specified input will be read\n               from stdin and the compressed texture written to stdout.\n\n  Options are:\n\n  -o outfile, --output=outfile\n               Writes the output to outfile. If outfile is \'stdout\', output\n               will be written to stdout. Parent directories will be\n               created if necessary. If there is more than 1 input file\n               the command prints its usage message and exits.\n  -f, --force  If the output file cannot be opened, remove it and create a\n               new file, without prompting for confirmation regardless of\n               its permissions.\n"
             ,0x2fe);
  scApp::usage(&this->super_scApp);
  return;
}

Assistant:

void
ktxSupercompressor::usage()
{
    cerr <<
        "Usage: " << name  << " [options] [<infile> ...]\n"
        "\n"
        "  infile       The ktx2 file(s) to supercompress. The output is written to a\n"
        "               file of the same name. If infile not specified input will be read\n"
        "               from stdin and the compressed texture written to stdout.\n"
        "\n"
        "  Options are:\n"
        "\n"
        "  -o outfile, --output=outfile\n"
        "               Writes the output to outfile. If outfile is 'stdout', output\n"
        "               will be written to stdout. Parent directories will be\n"
        "               created if necessary. If there is more than 1 input file\n"
        "               the command prints its usage message and exits.\n"
        "  -f, --force  If the output file cannot be opened, remove it and create a\n"
        "               new file, without prompting for confirmation regardless of\n"
        "               its permissions.\n";
        scApp::usage();
}